

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Float pbrt::SphericalTriangleArea(Vector3f *a,Vector3f *b,Vector3f *c)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float local_b0;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  fVar21 = (a->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar13 = (a->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar17 = (b->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar23 = (a->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar18 = (b->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar1 = (b->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar13),
                            ZEXT416((uint)(fVar23 * fVar1)));
  auVar20 = ZEXT416((uint)fVar23);
  auVar22 = ZEXT416((uint)fVar1);
  auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar1)),auVar20,auVar22);
  fVar27 = auVar10._0_4_ + auVar9._0_4_;
  auVar10 = vfmsub213ss_fma(ZEXT416((uint)fVar18),auVar20,ZEXT416((uint)(fVar17 * fVar21)));
  auVar19 = ZEXT416((uint)fVar21);
  auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar21)),auVar19,ZEXT416((uint)fVar17));
  fVar26 = auVar10._0_4_ + auVar9._0_4_;
  auVar10 = vfmsub213ss_fma(auVar22,auVar19,ZEXT416((uint)(fVar13 * fVar18)));
  auVar9 = vfnmadd231ss_fma(ZEXT416((uint)(fVar13 * fVar18)),ZEXT416((uint)fVar13),
                            ZEXT416((uint)fVar18));
  fVar24 = auVar10._0_4_ + auVar9._0_4_;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar26 * fVar26)),ZEXT416((uint)fVar27),
                            ZEXT416((uint)fVar27));
  auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
  fVar11 = auVar10._0_4_;
  if ((fVar11 != 0.0) || (NAN(fVar11))) {
    fVar12 = (c->super_Tuple3<pbrt::Vector3,_float>).z;
    fVar2 = (c->super_Tuple3<pbrt::Vector3,_float>).x;
    fVar3 = (c->super_Tuple3<pbrt::Vector3,_float>).y;
    auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar12),auVar22,ZEXT416((uint)(fVar17 * fVar3)));
    auVar25 = ZEXT416((uint)fVar3);
    auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar3)),ZEXT416((uint)fVar17),auVar25);
    fVar4 = auVar9._0_4_ + auVar7._0_4_;
    auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar17),ZEXT416((uint)fVar2),
                             ZEXT416((uint)(fVar12 * fVar18)));
    auVar7 = vfnmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar18)),ZEXT416((uint)fVar18),
                              ZEXT416((uint)fVar12));
    fVar17 = auVar7._0_4_ + auVar9._0_4_;
    auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar18),auVar25,ZEXT416((uint)(fVar2 * fVar1)));
    auVar22 = vfnmadd213ss_fma(auVar22,ZEXT416((uint)fVar2),ZEXT416((uint)(fVar2 * fVar1)));
    fVar18 = auVar9._0_4_ + auVar22._0_4_;
    auVar9 = vmulss_avx512f(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
    auVar9 = vfmadd231ss_avx512f(auVar9,ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    vfmadd231ss_avx512f(auVar9,ZEXT416((uint)fVar18),ZEXT416((uint)fVar18));
    vucomiss_avx512f(ZEXT816(0) << 0x40);
    if ((fVar11 != 0.0) || (NAN(fVar11))) {
      auVar9 = vfmsub213ss_fma(auVar20,auVar25,ZEXT416((uint)(fVar12 * fVar13)));
      auVar22 = vfnmadd231ss_fma(ZEXT416((uint)(fVar12 * fVar13)),ZEXT416((uint)fVar12),
                                 ZEXT416((uint)fVar13));
      fVar1 = auVar9._0_4_ + auVar22._0_4_;
      auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar12),auVar19,ZEXT416((uint)(fVar2 * fVar23)));
      auVar20 = vfnmadd213ss_fma(auVar20,ZEXT416((uint)fVar2),ZEXT416((uint)(fVar2 * fVar23)));
      fVar23 = auVar9._0_4_ + auVar20._0_4_;
      auVar9 = vfmsub213ss_fma(ZEXT416((uint)fVar13),ZEXT416((uint)fVar2),
                               ZEXT416((uint)(fVar21 * fVar3)));
      auVar19 = vfnmadd213ss_fma(auVar19,auVar25,ZEXT416((uint)(fVar21 * fVar3)));
      fVar21 = auVar9._0_4_ + auVar19._0_4_;
      auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),ZEXT416((uint)fVar1),
                               ZEXT416((uint)fVar1));
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
      fVar13 = auVar9._0_4_;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        uVar8 = fVar11 < 0.0;
        if ((bool)uVar8) {
          fVar11 = sqrtf(fVar11);
        }
        else {
          auVar10 = vsqrtss_avx(auVar10,auVar10);
          fVar11 = auVar10._0_4_;
        }
        auVar10 = vucomiss_avx512f(ZEXT816(0) << 0x40);
        if ((bool)uVar8) {
          fVar12 = sqrtf(auVar10._0_4_);
        }
        else {
          auVar10 = vsqrtss_avx512f(auVar10,auVar10);
          fVar12 = auVar10._0_4_;
        }
        fVar27 = fVar27 / fVar11;
        fVar26 = fVar26 / fVar11;
        fVar24 = fVar24 / fVar11;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          auVar10 = vsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
          fVar13 = auVar10._0_4_;
        }
        auVar9._0_4_ = fVar4 / fVar12;
        auVar9._4_12_ = SUB6012((undefined1  [60])0x0,0);
        fVar17 = fVar17 / fVar12;
        fVar18 = fVar18 / fVar12;
        auVar19._0_4_ = fVar1 / fVar13;
        auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
        fVar23 = fVar23 / fVar13;
        fVar21 = fVar21 / fVar13;
        auVar10 = vfnmsub231ss_fma(ZEXT416((uint)(fVar26 * fVar23)),ZEXT416((uint)fVar27),auVar19);
        auVar10 = vfnmadd231ss_fma(auVar10,ZEXT416((uint)fVar24),ZEXT416((uint)fVar21));
        if (0.0 <= auVar10._0_4_) {
          auVar10 = vfmadd231ss_fma(ZEXT416((uint)((-fVar23 - fVar26) * (-fVar23 - fVar26))),
                                    ZEXT416((uint)(-auVar19._0_4_ - fVar27)),
                                    ZEXT416((uint)(-auVar19._0_4_ - fVar27)));
          auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(-fVar21 - fVar24)),
                                    ZEXT416((uint)(-fVar21 - fVar24)));
          if (auVar10._0_4_ < 0.0) {
            fVar13 = sqrtf(auVar10._0_4_);
          }
          else {
            auVar10 = vsqrtss_avx(auVar10,auVar10);
            fVar13 = auVar10._0_4_;
          }
          auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar13 * 0.5)));
          uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar13 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          local_b0 = asinf((float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_));
          local_b0 = local_b0 + local_b0;
        }
        else {
          auVar10 = vfmadd231ss_fma(ZEXT416((uint)((fVar26 - fVar23) * (fVar26 - fVar23))),
                                    ZEXT416((uint)(fVar27 - auVar19._0_4_)),
                                    ZEXT416((uint)(fVar27 - auVar19._0_4_)));
          auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(fVar24 - fVar21)),
                                    ZEXT416((uint)(fVar24 - fVar21)));
          if (auVar10._0_4_ < 0.0) {
            fVar13 = sqrtf(auVar10._0_4_);
          }
          else {
            auVar10 = vsqrtss_avx(auVar10,auVar10);
            fVar13 = auVar10._0_4_;
          }
          auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar13 * 0.5)));
          uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar13 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          auVar14._0_4_ = asinf((float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_));
          auVar14._4_60_ = extraout_var;
          auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar14._0_16_,
                                    ZEXT416(0x40490fdb));
          local_b0 = auVar10._0_4_;
        }
        auVar10 = vfnmsub231ss_fma(ZEXT416((uint)(fVar26 * fVar17)),auVar9,ZEXT416((uint)fVar27));
        auVar10 = vfnmadd231ss_fma(auVar10,ZEXT416((uint)fVar18),ZEXT416((uint)fVar24));
        if (0.0 <= auVar10._0_4_) {
          auVar10 = vfmadd231ss_fma(ZEXT416((uint)((-fVar26 - fVar17) * (-fVar26 - fVar17))),
                                    ZEXT416((uint)(-fVar27 - auVar9._0_4_)),
                                    ZEXT416((uint)(-fVar27 - auVar9._0_4_)));
          auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(-fVar24 - fVar18)),
                                    ZEXT416((uint)(-fVar24 - fVar18)));
          if (auVar10._0_4_ < 0.0) {
            fVar13 = sqrtf(auVar10._0_4_);
          }
          else {
            auVar10 = vsqrtss_avx(auVar10,auVar10);
            fVar13 = auVar10._0_4_;
          }
          auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar13 * 0.5)));
          uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar13 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          fVar13 = asinf((float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_));
          fVar13 = fVar13 + fVar13;
        }
        else {
          auVar10 = vfmadd231ss_fma(ZEXT416((uint)((fVar17 - fVar26) * (fVar17 - fVar26))),
                                    ZEXT416((uint)(auVar9._0_4_ - fVar27)),
                                    ZEXT416((uint)(auVar9._0_4_ - fVar27)));
          auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(fVar18 - fVar24)),
                                    ZEXT416((uint)(fVar18 - fVar24)));
          if (auVar10._0_4_ < 0.0) {
            fVar13 = sqrtf(auVar10._0_4_);
          }
          else {
            auVar10 = vsqrtss_avx(auVar10,auVar10);
            fVar13 = auVar10._0_4_;
          }
          auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar13 * 0.5)));
          uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar13 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          auVar15._0_4_ = asinf((float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_));
          auVar15._4_60_ = extraout_var_00;
          auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar15._0_16_,
                                    ZEXT416(0x40490fdb));
          fVar13 = auVar10._0_4_;
        }
        auVar10 = vfnmsub231ss_fma(ZEXT416((uint)(fVar23 * fVar17)),auVar19,auVar9);
        auVar10 = vfnmadd231ss_fma(auVar10,ZEXT416((uint)fVar21),ZEXT416((uint)fVar18));
        if (0.0 <= auVar10._0_4_) {
          auVar10 = vfmadd231ss_fma(ZEXT416((uint)((-fVar17 - fVar23) * (-fVar17 - fVar23))),
                                    ZEXT416((uint)(-auVar9._0_4_ - auVar19._0_4_)),
                                    ZEXT416((uint)(-auVar9._0_4_ - auVar19._0_4_)));
          auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(-fVar18 - fVar21)),
                                    ZEXT416((uint)(-fVar18 - fVar21)));
          if (auVar10._0_4_ < 0.0) {
            fVar21 = sqrtf(auVar10._0_4_);
          }
          else {
            auVar10 = vsqrtss_avx(auVar10,auVar10);
            fVar21 = auVar10._0_4_;
          }
          auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar21 * 0.5)));
          uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar21 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          fVar21 = asinf((float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_));
          fVar21 = fVar21 + fVar21;
        }
        else {
          auVar10 = vfmadd231ss_fma(ZEXT416((uint)((fVar23 - fVar17) * (fVar23 - fVar17))),
                                    ZEXT416((uint)(auVar19._0_4_ - auVar9._0_4_)),
                                    ZEXT416((uint)(auVar19._0_4_ - auVar9._0_4_)));
          auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)(fVar21 - fVar18)),
                                    ZEXT416((uint)(fVar21 - fVar18)));
          if (auVar10._0_4_ < 0.0) {
            fVar21 = sqrtf(auVar10._0_4_);
          }
          else {
            auVar10 = vsqrtss_avx(auVar10,auVar10);
            fVar21 = auVar10._0_4_;
          }
          auVar10 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar21 * 0.5)));
          uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar21 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
          bVar6 = (bool)((byte)uVar5 & 1);
          auVar16._0_4_ = asinf((float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_));
          auVar16._4_60_ = extraout_var_01;
          auVar10 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar16._0_16_,
                                    ZEXT416(0x40490fdb));
          fVar21 = auVar10._0_4_;
        }
        auVar10._8_4_ = 0x7fffffff;
        auVar10._0_8_ = 0x7fffffff7fffffff;
        auVar10._12_4_ = 0x7fffffff;
        auVar10 = vandps_avx512vl(ZEXT416((uint)(fVar13 + local_b0 + fVar21 + -3.1415927)),auVar10);
        return auVar10._0_4_;
      }
    }
  }
  return 0.0;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v, const Vector3<T> &w) {
    DCHECK(!v.HasNaN() && !w.HasNaN());
    return {DifferenceOfProducts(v.y, w.z, v.z, w.y),
            DifferenceOfProducts(v.z, w.x, v.x, w.z),
            DifferenceOfProducts(v.x, w.y, v.y, w.x)};
}